

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O0

bool inipp::extract<char,short>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,short *dst)

{
  bool bVar1;
  byte bVar2;
  istream *piVar3;
  long *plVar4;
  short local_1aa;
  istringstream local_1a8 [6];
  short result;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> is;
  char local_21;
  short *psStack_20;
  char c;
  short *dst_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  
  psStack_20 = dst;
  dst_local = (short *)value;
  std::__cxx11::istringstream::istringstream(local_1a8,value,8);
  piVar3 = (istream *)std::istream::operator>>((istream *)local_1a8,std::boolalpha);
  plVar4 = (long *)std::istream::operator>>(piVar3,&local_1aa);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
  if (bVar1) {
    piVar3 = std::operator>>((istream *)local_1a8,&local_21);
    bVar2 = std::ios::operator!((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if ((bVar2 & 1) != 0) {
      *psStack_20 = local_1aa;
      value_local._7_1_ = 1;
      goto LAB_0011bfa3;
    }
  }
  value_local._7_1_ = 0;
LAB_0011bfa3:
  std::__cxx11::istringstream::~istringstream(local_1a8);
  return (bool)(value_local._7_1_ & 1);
}

Assistant:

inline bool extract(const std::basic_string<CharT> & value, T & dst) {
	CharT c;
	std::basic_istringstream<CharT> is{ value };
	T result;
	if ((is >> std::boolalpha >> result) && !(is >> c)) {
		dst = result;
		return true;
	}
	else {
		return false;
	}
}